

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

int pnga_deregister_type(int type)

{
  int iVar1;
  int tp;
  int type_local;
  int local_4;
  
  iVar1 = type + -1000;
  if (iVar1 < 0x11) {
    local_4 = -1;
  }
  else if (ga_types[iVar1].active == 0) {
    local_4 = -2;
  }
  else {
    ga_types[iVar1].active = 0;
    ga_types[iVar1].size = 0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int pnga_deregister_type(int type) {
  int tp = type-MT_BASE;
  if(tp<GA_TYPES_RESERVED) {
    return -1;
  }
  if(ga_types[tp].active==0) {
    return -2;
  }
  ga_types[tp].active = 0;
  ga_types[tp].size = 0;
  return 0;  
}